

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O1

JsErrorCode JsGetPromiseState(JsValueRef promise,JsPromiseState *state)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  JsErrorCode JVar4;
  JsPromiseState JVar5;
  JsrtContext *currentContext;
  undefined4 *puVar6;
  RecyclableObject *value;
  JavascriptPromise *pJVar7;
  ScriptContext *__localScriptContext;
  void *unaff_retaddr;
  undefined1 auStack_98 [8];
  TTDebuggerAbortException anon_var_0;
  undefined1 local_58 [8];
  EnterScriptObject __enterScriptObject;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  currentContext = JsrtContext::GetCurrent();
  JVar4 = CheckContext(currentContext,false,false);
  if (JVar4 != JsNoError) {
    return JVar4;
  }
  scriptContext =
       (((currentContext->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&__enterScriptObject.library + 4),
             ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
  anon_var_0.m_staticAbortMessage = (char16 *)0x0;
  anon_var_0.m_optEventTime = 0;
  anon_var_0.m_optMoveMode = 0;
  auStack_98 = (undefined1  [8])0x0;
  anon_var_0.m_abortCode = 0;
  anon_var_0._4_4_ = 0;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)local_58,scriptContext,(ScriptEntryExitRecord *)auStack_98,
             unaff_retaddr,&stack0x00000000,true,true,true);
  Js::ScriptContext::OnScriptStart(scriptContext,true,true);
  Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_58);
  if (scriptContext->TTDShouldPerformRecordAction == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/JsrtCore.cpp"
                       ,0x3e0,"(false)","Need to implement support here!!!");
    if (!bVar3) goto LAB_003cb7d5;
    *puVar6 = 0;
  }
  JVar4 = JsErrorInvalidArgument;
  if (promise != (JsValueRef)0x0) {
    if ((ulong)promise >> 0x30 == 0) {
      value = Js::VarTo<Js::RecyclableObject>(promise);
      pSVar1 = (((((value->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != scriptContext) {
        JVar4 = JsErrorWrongRuntime;
        if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_003cb4fc;
        promise = Js::CrossSite::MarshalVar(scriptContext,value,false);
      }
    }
    if (state == (JsPromiseState *)0x0) {
      JVar4 = JsErrorNullArgument;
    }
    else {
      *state = JsPromiseStatePending;
      bVar3 = Js::VarIs<Js::JavascriptPromise>(promise);
      JVar4 = JsErrorInvalidArgument;
      if (bVar3) {
        pJVar7 = Js::VarTo<Js::JavascriptPromise>(promise);
        JVar4 = JsNoError;
        if (pJVar7->status == PromiseStatusCode_HasRejection) {
          JVar5 = JsPromiseStateRejected;
        }
        else {
          if (pJVar7->status != PromiseStatusCode_HasResolution) goto LAB_003cb4fc;
          JVar5 = JsPromiseStateFulfilled;
        }
        *state = JVar5;
      }
    }
  }
LAB_003cb4fc:
  Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_58);
  if ((JVar4 == JsErrorFatal) || (JVar4 == JsErrorNoCurrentContext)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/../JsrtInternal.h"
                       ,0xcc,
                       "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                       ,
                       "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                      );
    if (!bVar3) {
LAB_003cb7d5:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&__enterScriptObject.library + 4));
  return JVar4;
}

Assistant:

CHAKRA_API JsGetPromiseState(_In_ JsValueRef promise, _Out_ JsPromiseState *state)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION_NOT_IMPLEMENTED(scriptContext);

        VALIDATE_INCOMING_REFERENCE(promise, scriptContext);
        PARAM_NOT_NULL(state);

        *state = JsPromiseStatePending;

        if (!Js::VarIs<Js::JavascriptPromise>(promise))
        {
            return JsErrorInvalidArgument;
        }

        Js::JavascriptPromise *jsPromise = Js::VarTo<Js::JavascriptPromise>(promise);
        Js::JavascriptPromise::PromiseStatus status = jsPromise->GetStatus();

        switch (status)
        {
        case Js::JavascriptPromise::PromiseStatus::PromiseStatusCode_HasRejection:
            *state = JsPromiseStateRejected;
            break;

        case Js::JavascriptPromise::PromiseStatus::PromiseStatusCode_HasResolution:
            *state = JsPromiseStateFulfilled;
            break;
        }

        return JsNoError;
    });
}